

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O1

void Assimp::IFC::CleanupOuterContour
               (vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *contour_flat,
               TempMesh *curmesh)

{
  pointer paVar1;
  pointer pIVar2;
  pointer paVar3;
  pointer paVar4;
  pointer paVar5;
  pointer puVar6;
  pointer puVar7;
  pointer puVar8;
  double dVar9;
  IntPoint *pIVar10;
  long64 lVar11;
  pointer pEVar12;
  bool bVar13;
  ulong uVar14;
  IntPoint *pIVar15;
  IntPoint *pIVar16;
  IfcVector2 *pip;
  pointer paVar17;
  pointer pEVar18;
  IntPoint *point;
  pointer pIVar19;
  Polygon subject;
  Polygon clip;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> vold;
  vector<unsigned_int,_std::allocator<unsigned_int>_> iold;
  IfcVector3 *pip_1;
  ExPolygons clipped;
  Clipper clipper;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_288;
  aiVector3t<double> local_268;
  ulong local_250;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> local_248;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> local_228;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_208;
  pointer local_1f0;
  ExPolygons local_1e8;
  long local_1c0;
  TempMesh *local_1b8;
  pointer local_1b0;
  Clipper local_1a8;
  
  local_228.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
            (&local_228,
             ((long)(curmesh->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(curmesh->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&local_208,
             (long)(curmesh->mVertcnt).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(curmesh->mVertcnt).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  local_288.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (IntPoint *)0x0;
  local_288.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (IntPoint *)0x0;
  local_288.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (IntPoint *)0x0;
  ClipperLib::Clipper::Clipper(&local_1a8);
  local_1e8.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_248.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (IntPoint *)0x0;
  local_248.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (IntPoint *)0x0;
  local_248.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (IntPoint *)0x0;
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::reserve
            (&local_248,
             (long)(contour_flat->
                   super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(contour_flat->
                   super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 4);
  paVar17 = (contour_flat->
            super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
            super__Vector_impl_data._M_start;
  paVar1 = (contour_flat->
           super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (paVar17 != paVar1) {
    do {
      dVar9 = paVar17->x * 1518500249.0;
      uVar14 = (ulong)dVar9;
      local_268.x = (double)((long)(dVar9 - 9.223372036854776e+18) & (long)uVar14 >> 0x3f | uVar14);
      dVar9 = paVar17->y * 1518500249.0;
      uVar14 = (ulong)dVar9;
      local_268.y = (double)((long)(dVar9 - 9.223372036854776e+18) & (long)uVar14 >> 0x3f | uVar14);
      if (local_248.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_248.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
        _M_realloc_insert<ClipperLib::IntPoint>
                  (&local_248,
                   (iterator)
                   local_248.
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(IntPoint *)&local_268);
      }
      else {
        (local_248.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
         _M_impl.super__Vector_impl_data._M_finish)->X = (long64)local_268.x;
        (local_248.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
         _M_impl.super__Vector_impl_data._M_finish)->Y = (long64)local_268.y;
        local_248.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_248.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_finish + 1;
      }
      paVar17 = paVar17 + 1;
    } while (paVar17 != paVar1);
  }
  bVar13 = ClipperLib::Orientation(&local_248);
  if ((!bVar13) &&
     (pIVar16 = local_248.
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                _M_impl.super__Vector_impl_data._M_finish + -1,
     pIVar10 = local_248.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_start,
     local_248.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
     _M_impl.super__Vector_impl_data._M_start < pIVar16 &&
     local_248.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
     _M_impl.super__Vector_impl_data._M_start !=
     local_248.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
     _M_impl.super__Vector_impl_data._M_finish)) {
    do {
      pIVar15 = pIVar10 + 1;
      local_268.x = (double)pIVar10->X;
      local_268.y = (double)pIVar10->Y;
      lVar11 = pIVar16->Y;
      pIVar10->X = pIVar16->X;
      pIVar10->Y = lVar11;
      pIVar16->X = (long64)local_268.x;
      pIVar16->Y = (long64)local_268.y;
      pIVar16 = pIVar16 + -1;
      pIVar10 = pIVar15;
    } while (pIVar15 < pIVar16);
  }
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::reserve(&local_288,4);
  local_1f0 = (curmesh->mVerts).
              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_1b0 = (curmesh->mVerts).
              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (local_1f0 != local_1b0) {
    local_1c0 = 0;
    local_250 = 0;
    local_1b8 = curmesh;
    do {
      if (local_250 == 0) {
        local_250 = (ulong)(curmesh->mVertcnt).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start[local_1c0];
        local_1c0 = local_1c0 + 1;
        if (local_250 != 0) goto LAB_005b2eb8;
        local_250 = 0;
      }
      else {
LAB_005b2eb8:
        dVar9 = local_1f0->x * 1518500249.0;
        uVar14 = (ulong)dVar9;
        local_268.x = (double)((long)(dVar9 - 9.223372036854776e+18) & (long)uVar14 >> 0x3f | uVar14
                              );
        dVar9 = local_1f0->y * 1518500249.0;
        uVar14 = (ulong)dVar9;
        local_268.y = (double)((long)(dVar9 - 9.223372036854776e+18) & (long)uVar14 >> 0x3f | uVar14
                              );
        if (local_288.
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_288.
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::
          _M_realloc_insert<ClipperLib::IntPoint>
                    (&local_288,
                     (iterator)
                     local_288.
                     super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(IntPoint *)&local_268);
        }
        else {
          (local_288.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
           ._M_impl.super__Vector_impl_data._M_finish)->X = (long64)local_268.x;
          (local_288.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
           ._M_impl.super__Vector_impl_data._M_finish)->Y = (long64)local_268.y;
          local_288.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_288.
               super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        local_250 = local_250 - 1;
        if (local_250 == 0) {
          bVar13 = ClipperLib::Orientation(&local_288);
          if ((!bVar13) &&
             (pIVar16 = local_288.
                        super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1,
             pIVar10 = local_288.
                       super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             local_288.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_start < pIVar16 &&
             local_288.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_start !=
             local_288.
             super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl
             .super__Vector_impl_data._M_finish)) {
            do {
              pIVar15 = pIVar10 + 1;
              local_268.x = (double)pIVar10->X;
              local_268.y = (double)pIVar10->Y;
              lVar11 = pIVar16->Y;
              pIVar10->X = pIVar16->X;
              pIVar10->Y = lVar11;
              pIVar16->X = (long64)local_268.x;
              pIVar16->Y = (long64)local_268.y;
              pIVar16 = pIVar16 + -1;
              pIVar10 = pIVar15;
            } while (pIVar15 < pIVar16);
          }
          ClipperLib::ClipperBase::AddPolygon
                    ((ClipperBase *)(local_1a8._vptr_Clipper[-3] + (long)&local_1a8),&local_288,
                     ptSubject);
          ClipperLib::ClipperBase::AddPolygon
                    ((ClipperBase *)(local_1a8._vptr_Clipper[-3] + (long)&local_1a8),&local_248,
                     ptClip);
          ClipperLib::Clipper::Execute(&local_1a8,ctIntersection,&local_1e8,pftNonZero,pftNonZero);
          pEVar12 = local_1e8.
                    super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (pEVar18 = local_1e8.
                         super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                         ._M_impl.super__Vector_impl_data._M_start; pEVar18 != pEVar12;
              pEVar18 = pEVar18 + 1) {
            local_268.x = (double)CONCAT44(local_268.x._4_4_,
                                           (int)((ulong)((long)(pEVar18->outer).
                                                                                                                              
                                                  super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(pEVar18->outer).
                                                                                                                
                                                  super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4));
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      (&local_208,(uint *)&local_268);
            pIVar2 = (pEVar18->outer).
                     super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pIVar19 = (pEVar18->outer).
                           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                           ._M_impl.super__Vector_impl_data._M_start; pIVar19 != pIVar2;
                pIVar19 = pIVar19 + 1) {
              local_268.x = (double)pIVar19->X / 1518500249.0;
              local_268.y = (double)pIVar19->Y / 1518500249.0;
              local_268.z = 0.0;
              if (local_228.
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_228.
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                _M_realloc_insert<aiVector3t<double>>
                          ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                           &local_228,
                           (iterator)
                           local_228.
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_268);
              }
              else {
                (local_228.
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->z = 0.0;
                (local_228.
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->x = local_268.x;
                (local_228.
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->y = local_268.y;
                local_228.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_finish =
                     local_228.
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
          }
          if (local_288.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              local_288.
              super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            local_288.
            super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_288.
                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                 _M_impl.super__Vector_impl_data._M_start;
          }
          std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::
          _M_erase_at_end(&local_1e8,
                          local_1e8.
                          super__Vector_base<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>
                          ._M_impl.super__Vector_impl_data._M_start);
          ClipperLib::Clipper::Clear(&local_1a8);
          curmesh = local_1b8;
        }
      }
      local_1f0 = local_1f0 + 1;
    } while (local_1f0 != local_1b0);
  }
  if (local_248.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
      _M_impl.super__Vector_impl_data._M_start != (IntPoint *)0x0) {
    operator_delete(local_248.
                    super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_248.
                          super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.
                          super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<ClipperLib::ExPolygon,_std::allocator<ClipperLib::ExPolygon>_>::~vector(&local_1e8);
  ClipperLib::Clipper::~Clipper(&local_1a8);
  if (local_288.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
      _M_impl.super__Vector_impl_data._M_start != (IntPoint *)0x0) {
    operator_delete(local_288.
                    super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_288.
                          super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_288.
                          super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  paVar3 = (curmesh->mVerts).
           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  paVar4 = (curmesh->mVerts).
           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  paVar5 = (curmesh->mVerts).
           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (curmesh->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_228.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (curmesh->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_228.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (curmesh->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_228.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  puVar6 = (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar7 = (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  puVar8 = (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (curmesh->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_228.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = paVar3;
  local_228.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = paVar4;
  local_228.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = paVar5;
  local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = puVar6;
  local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar7;
  local_208.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar8;
  if (puVar6 != (pointer)0x0) {
    operator_delete(puVar6,(long)puVar8 - (long)puVar6);
  }
  if (local_228.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_228.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.
                          super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CleanupOuterContour(const std::vector<IfcVector2>& contour_flat, TempMesh& curmesh)
{
    std::vector<IfcVector3> vold;
    std::vector<unsigned int> iold;

    vold.reserve(curmesh.mVerts.size());
    iold.reserve(curmesh.mVertcnt.size());

    // Fix the outer contour using polyclipper
    try {

        ClipperLib::Polygon subject;
        ClipperLib::Clipper clipper;
        ClipperLib::ExPolygons clipped;

        ClipperLib::Polygon clip;
        clip.reserve(contour_flat.size());
        for(const IfcVector2& pip : contour_flat) {
            clip.push_back(ClipperLib::IntPoint(  to_int64(pip.x), to_int64(pip.y) ));
        }

        if (!ClipperLib::Orientation(clip)) {
            std::reverse(clip.begin(), clip.end());
        }

        // We need to run polyclipper on every single polygon -- we can't run it one all
        // of them at once or it would merge them all together which would undo all
        // previous steps
        subject.reserve(4);
        size_t index = 0;
        size_t countdown = 0;
        for(const IfcVector3& pip : curmesh.mVerts) {
            if (!countdown) {
                countdown = curmesh.mVertcnt[index++];
                if (!countdown) {
                    continue;
                }
            }
            subject.push_back(ClipperLib::IntPoint(  to_int64(pip.x), to_int64(pip.y) ));
            if (--countdown == 0) {
                if (!ClipperLib::Orientation(subject)) {
                    std::reverse(subject.begin(), subject.end());
                }

                clipper.AddPolygon(subject,ClipperLib::ptSubject);
                clipper.AddPolygon(clip,ClipperLib::ptClip);

                clipper.Execute(ClipperLib::ctIntersection,clipped,ClipperLib::pftNonZero,ClipperLib::pftNonZero);

                for(const ClipperLib::ExPolygon& ex : clipped) {
                    iold.push_back(static_cast<unsigned int>(ex.outer.size()));
                    for(const ClipperLib::IntPoint& point : ex.outer) {
                        vold.push_back(IfcVector3(
                            from_int64(point.X),
                            from_int64(point.Y),
                            0.0f));
                    }
                }

                subject.clear();
                clipped.clear();
                clipper.Clear();
            }
        }
    }
    catch (const char* sx) {
        IFCImporter::LogError("Ifc: error during polygon clipping, wall contour line may be wrong: (Clipper: "
            + std::string(sx) + ")");

        return;
    }

    // swap data arrays
    std::swap(vold,curmesh.mVerts);
    std::swap(iold,curmesh.mVertcnt);
}